

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O0

Signal<double,_int> * __thiscall
dynamicgraph::Signal<double,_int>::operator=(Signal<double,_int> *this,double *t)

{
  double *t_local;
  Signal<double,_int> *this_local;
  
  if ((((this->keepReference & 1U) == 0) || (this->signalType != REFERENCE_NON_CONST)) ||
     (this->TreferenceNonConst == (double *)0x0)) {
    (*(this->super_SignalBase<int>)._vptr_SignalBase[0x18])(this,t);
  }
  else if (this->providerMutex == (Mutex *)0x0) {
    setTcopy(this,t);
    *this->TreferenceNonConst = *t;
  }
  else {
    setTcopy(this,t);
    *this->TreferenceNonConst = *t;
  }
  return this;
}

Assistant:

Signal<T, Time> &Signal<T, Time>::operator=(const T &t) {
  if (keepReference && (REFERENCE_NON_CONST == signalType) &&
      (NULL != TreferenceNonConst)) {
    if (NULL == providerMutex) {
      setTcopy(t);
      (*TreferenceNonConst) = t;
    } else {
      try {
#ifdef HAVE_LIBBOOST_THREAD
        boost::try_mutex::scoped_try_lock lock(*providerMutex);
#endif
        setTcopy(t);
        (*TreferenceNonConst) = t;
      } catch (const MutexError &) { /* TODO ERROR */
      }
    }
  } else {
    setConstant(t);
  }
  return *this;
}